

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDefs.c
# Opt level: O0

void set_roomdef(tgestate_t *state,room_t room_index,int offset,int new_byte)

{
  int iVar1;
  undefined1 in_CL;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int index;
  
  iVar1 = get_roomdef_shadow((uint)in_SIL,in_EDX);
  if (-1 < iVar1) {
    *(undefined1 *)(in_RDI + 0x110 + (long)iVar1) = in_CL;
  }
  return;
}

Assistant:

void set_roomdef(tgestate_t *state,
                 room_t      room_index,
                 int         offset,
                 int         new_byte)
{
  int index;

  index = get_roomdef_shadow(room_index, offset);
  /* Allow setting of replacement bytes only. */
  if (index >= 0)
    state->roomdef_shadow_bytes[index] = new_byte;
  else
    assert("Unknown roomdef byte" == NULL);
}